

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAigToLogicSop(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  int *pfCompl;
  long *plVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  char *pcVar10;
  uint *__ptr;
  void *pvVar11;
  Vec_Ptr_t *pVVar12;
  Abc_Ntk_t *pAVar13;
  long lVar14;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                  ,0xfb,"Abc_Ntk_t *Abc_NtkAigToLogicSop(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar8 = Abc_AigConst1(pNtk);
  if (0 < (pAVar8->vFanouts).nSize) {
    pAVar9 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pAVar8->field_6).pCopy = pAVar9;
  }
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar12->pArray[lVar14];
      if ((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
        Abc_NtkDupObj(pNtk_00,pAVar8,0);
        pcVar10 = Abc_SopCreateAnd2((Mem_Flex_t *)pNtk_00->pManFunc,
                                    *(uint *)&pAVar8->field_0x14 >> 10 & 1,
                                    *(uint *)&pAVar8->field_0x14 >> 0xb & 1);
        (((pAVar8->field_6).pCopy)->field_5).pData = pcVar10;
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vObjs;
  if (pVVar12->nSize < 1) {
    bVar5 = true;
  }
  else {
    lVar14 = 0;
    bVar5 = false;
    do {
      puVar3 = (undefined8 *)pVVar12->pArray[lVar14];
      if ((puVar3 != (undefined8 *)0x0) && ((*(uint *)((long)puVar3 + 0x14) & 0xf) == 7)) {
        if (((ulong)puVar3 & 1) != 0) {
          pcVar10 = "!Abc_ObjIsComplement(pNode)";
LAB_001e1f4a:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (*(int *)*puVar3 != 3) {
          pcVar10 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_001e1f4a;
        }
        if ((puVar3[7] != 0) && (0 < *(int *)((long)puVar3 + 0x2c))) {
          pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
          __ptr = (uint *)malloc(0x10);
          __ptr[0] = 0x10;
          __ptr[1] = 0;
          pvVar11 = malloc(0x40);
          *(void **)(__ptr + 2) = pvVar11;
          uVar19 = 0x10;
          uVar18 = 0;
          puVar15 = puVar3;
          do {
            uVar1 = *(uint *)((long)puVar15 + 0x14);
            uVar2 = *(uint *)((long)puVar3 + 0x14);
            uVar6 = uVar19;
            if (uVar18 == uVar19) {
              if ((int)uVar19 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar11 = malloc(0x40);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr + 2),0x40);
                }
                *(void **)(__ptr + 2) = pvVar11;
                uVar20 = 0x10;
              }
              else {
                uVar20 = uVar19 * 2;
                if (SBORROW4(uVar19,uVar20) == 0 < (int)uVar19) goto LAB_001e1d01;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar11 = malloc((ulong)uVar20 << 2);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar20 << 2);
                }
                *(void **)(__ptr + 2) = pvVar11;
              }
              uVar6 = uVar20;
              if (pvVar11 == (void *)0x0) {
                __ptr[1] = (uint)uVar18;
                *__ptr = uVar19;
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
LAB_001e1d01:
            uVar19 = uVar6;
            *(uint *)(*(long *)(__ptr + 2) + uVar18 * 4) = (uVar1 ^ uVar2) >> 7 & 1;
            uVar18 = uVar18 + 1;
            Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)puVar15[8]);
            puVar15 = (undefined8 *)puVar15[7];
          } while (puVar15 != (undefined8 *)0x0);
          __ptr[1] = (uint)uVar18;
          *__ptr = uVar19;
          pfCompl = *(int **)(__ptr + 2);
          pcVar10 = Abc_SopCreateOrMultiCube((Mem_Flex_t *)pNtk_00->pManFunc,(uint)uVar18,pfCompl);
          (pAVar8->field_5).pData = pcVar10;
          *(Abc_Obj_t **)(puVar3[8] + 0x40) = pAVar8;
          if (pfCompl != (int *)0x0) {
            free(pfCompl);
            __ptr[2] = 0;
            __ptr[3] = 0;
          }
          free(__ptr);
          bVar5 = true;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar14 < pVVar12->nSize);
    bVar5 = !bVar5;
  }
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar12->pArray[lVar14];
      if (((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) &&
         (0 < *(int *)((long)plVar4 + 0x1c))) {
        lVar17 = 0;
        do {
          pAVar8 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)(plVar4[4] + lVar17 * 4) * 8) + 0x40);
          if ((pAVar8->field_6).pCopy == (Abc_Obj_t *)0x0) {
            pAVar9 = (Abc_Obj_t *)plVar4[8];
          }
          else {
            pAVar9 = (Abc_Obj_t *)plVar4[8];
            pAVar8 = (pAVar8->field_6).pCopy;
          }
          Abc_ObjAddFanin(pAVar9,pAVar8);
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vCos;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar12->pArray[lVar14];
      uVar18 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)plVar4[4] * 8) + 0x40);
      uVar16 = *(ulong *)(uVar18 + 0x40);
      if (uVar16 == 0) {
        uVar16 = uVar18;
      }
      Abc_ObjAddFanin((Abc_Obj_t *)plVar4[8],
                      (Abc_Obj_t *)(uVar16 ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1));
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vCos;
    } while (lVar14 < pVVar12->nSize);
  }
  if (bVar5) {
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  }
  else {
    Abc_NtkLogicMakeSimpleCos2(pNtk_00,0);
  }
  pAVar13 = pNtk->pExdc;
  if (pAVar13 != (Abc_Ntk_t *)0x0) {
    if (pAVar13->ntkType == ABC_NTK_STRASH) {
      pAVar13 = Abc_NtkAigToLogicSop(pAVar13);
    }
    else {
      pAVar13 = Abc_NtkDup(pAVar13);
    }
    pNtk_00->pExdc = pAVar13;
  }
  iVar7 = Abc_NtkCheck(pNtk_00);
  if (iVar7 == 0) {
    fwrite("Abc_NtkAigToLogicSop(): Network check has failed.\n",0x32,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}